

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

void cs_free(cs_insn *insn,size_t count)

{
  ulong local_20;
  size_t i;
  size_t count_local;
  cs_insn *insn_local;
  
  for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
    (*cs_mem_free)(insn[local_20].detail);
  }
  (*cs_mem_free)(insn);
  return;
}

Assistant:

CAPSTONE_API cs_free(cs_insn *insn, size_t count)
{
	size_t i;

	// free all detail pointers
	for (i = 0; i < count; i++)
		cs_mem_free(insn[i].detail);

	// then free pointer to cs_insn array
	cs_mem_free(insn);
}